

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O3

void G_BuildTiccmd(ticcmd_t *cmd)

{
  byte *pbVar1;
  short *psVar2;
  int iVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  undefined2 uVar7;
  BYTE BVar8;
  BYTE BVar9;
  BYTE BVar10;
  int iVar11;
  ticcmd_t *ptVar12;
  int iVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  short sVar17;
  short sVar18;
  int iVar19;
  short sVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  float joyaxes [5];
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  double local_38;
  
  ptVar12 = I_BaseTiccmd();
  sVar20 = (ptVar12->ucmd).pitch;
  sVar18 = (ptVar12->ucmd).yaw;
  sVar17 = (ptVar12->ucmd).roll;
  sVar4 = (ptVar12->ucmd).forwardmove;
  sVar5 = (ptVar12->ucmd).sidemove;
  sVar6 = (ptVar12->ucmd).upmove;
  (cmd->ucmd).buttons = (ptVar12->ucmd).buttons;
  (cmd->ucmd).pitch = sVar20;
  (cmd->ucmd).yaw = sVar18;
  (cmd->ucmd).roll = sVar17;
  (cmd->ucmd).forwardmove = sVar4;
  (cmd->ucmd).sidemove = sVar5;
  (cmd->ucmd).upmove = sVar6;
  uVar7 = *(undefined2 *)&ptVar12->field_0x12;
  cmd->consistancy = ptVar12->consistancy;
  iVar19 = ticdup;
  *(undefined2 *)&cmd->field_0x12 = uVar7;
  cmd->consistancy = consistancy[consoleplayer][(maketic / ticdup) % 0x24];
  BVar10 = Button_Strafe.bDown;
  bVar14 = cl_run.Value ^ Button_Speed.bDown;
  iVar13 = 0;
  turnheld = iVar19 + turnheld;
  if (Button_Left.bDown == '\0' && Button_Right.bDown == '\0') {
    turnheld = 0;
  }
  if (Button_Strafe.bDown == '\0') {
    uVar15 = bVar14 + 2;
    if (5 < turnheld) {
      uVar15 = (uint)bVar14;
    }
    if (Button_Right.bDown != '\0') {
      G_AddViewAngle(angleturn[uVar15]);
      LocalKeyboardTurner = true;
    }
    if (Button_Left.bDown == '\0') {
      iVar13 = 0;
    }
    else {
      iVar13 = 0;
      G_AddViewAngle(-angleturn[uVar15]);
      LocalKeyboardTurner = true;
    }
  }
  else {
    if (Button_Right.bDown != '\0') {
      iVar13 = sidemove[bVar14];
    }
    if (Button_Left.bDown != '\0') {
      iVar13 = iVar13 - sidemove[bVar14];
    }
  }
  if (Button_LookUp.bDown != '\0') {
    G_AddViewPitch(lookspeed[bVar14]);
    LocalKeyboardTurner = true;
  }
  if (Button_LookDown.bDown != '\0') {
    G_AddViewPitch(-lookspeed[bVar14]);
    LocalKeyboardTurner = true;
  }
  if (Button_MoveUp.bDown == '\0') {
    sVar20 = 0;
  }
  else {
    sVar20 = (short)flyspeed[bVar14];
  }
  if (Button_MoveDown.bDown != '\0') {
    sVar20 = sVar20 - (short)flyspeed[bVar14];
  }
  if (Button_Klook.bDown == '\0') {
    if (Button_Forward.bDown == '\0') {
      iVar19 = 0;
    }
    else {
      iVar19 = forwardmove[bVar14];
    }
    if (Button_Back.bDown != '\0') {
      iVar19 = iVar19 - forwardmove[bVar14];
    }
  }
  else {
    if (Button_Forward.bDown != '\0') {
      G_AddViewPitch(lookspeed[bVar14]);
    }
    if (Button_Back.bDown == '\0') {
      iVar19 = 0;
    }
    else {
      iVar19 = 0;
      G_AddViewPitch(-lookspeed[bVar14]);
    }
  }
  BVar9 = Button_MoveLeft.bDown;
  BVar8 = Button_MoveRight.bDown;
  if (Button_MoveRight.bDown != '\0') {
    iVar13 = iVar13 + sidemove[bVar14];
  }
  if (Button_MoveLeft.bDown != '\0') {
    iVar13 = iVar13 - sidemove[bVar14];
  }
  if (Button_Attack.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 1;
  }
  if (Button_AltAttack.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 0x20;
  }
  if (Button_Use.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 2;
  }
  if (Button_Jump.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 4;
  }
  if (Button_Crouch.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 8;
  }
  if (Button_Zoom.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 0x80;
  }
  if (Button_Reload.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 0x40;
  }
  if (Button_User1.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 0x20;
  }
  if (Button_User2.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 0x40;
  }
  if (Button_User3.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if (Button_User4.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 3);
    *pbVar1 = *pbVar1 | 1;
  }
  if (Button_Speed.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  if (Button_Strafe.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  if (BVar8 != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  if (BVar9 != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  if (Button_LookDown.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 2;
  }
  if (Button_LookUp.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 1;
  }
  if (Button_Back.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  if (Button_Forward.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  if (Button_Right.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  if (Button_Left.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if (Button_MoveDown.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 8;
  }
  if (Button_MoveUp.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 4;
  }
  if (Button_ShowScores.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 0x10;
  }
  I_GetAxes(&local_58);
  if (Button_Strafe.bDown == '\0') {
    if (Button_Mlook.bDown == '\0') goto LAB_00389b5d;
    if (lookstrafe.Value == true) {
      local_4c = local_58;
      local_58 = 0.0;
    }
  }
  else {
    local_4c = local_58;
    local_58 = 0.0;
    if (Button_Mlook.bDown == '\0') goto LAB_00389b5d;
  }
  local_54 = local_50;
  local_50 = 0.0;
LAB_00389b5d:
  if ((local_54 != 0.0) || (NAN(local_54))) {
    dVar21 = (double)(local_54 * 2048.0);
    if (0.0 <= local_54 * 2048.0) {
      dVar21 = ceil(dVar21);
    }
    else {
      dVar21 = floor(dVar21);
    }
    G_AddViewPitch((int)dVar21);
    LocalKeyboardTurner = true;
  }
  if ((local_58 != 0.0) || (NAN(local_58))) {
    dVar21 = (double)(local_58 * -1280.0);
    if (0.0 <= local_58 * -1280.0) {
      dVar21 = ceil(dVar21);
    }
    else {
      dVar21 = floor(dVar21);
    }
    G_AddViewAngle((int)dVar21);
    LocalKeyboardTurner = true;
  }
  dVar21 = (double)((float)sidemove[bVar14] * local_4c);
  if (0.0 <= (float)sidemove[bVar14] * local_4c) {
    local_38 = ceil(dVar21);
  }
  else {
    local_38 = floor(dVar21);
  }
  dVar21 = (double)((float)forwardmove[bVar14] * local_50);
  if (0.0 <= (float)forwardmove[bVar14] * local_50) {
    dVar21 = ceil(dVar21);
  }
  else {
    dVar21 = floor(dVar21);
  }
  dVar22 = (double)(local_48 * 2048.0);
  if (0.0 <= local_48 * 2048.0) {
    dVar22 = ceil(dVar22);
  }
  else {
    dVar22 = floor(dVar22);
  }
  iVar19 = iVar19 + (int)dVar21;
  if ((Button_Mlook.bDown == '\0') && (freelook.Value == false)) {
    iVar19 = iVar19 + (int)((float)mousey * m_forward.Value);
  }
  (cmd->ucmd).pitch = LocalViewPitch._2_2_;
  iVar11 = forwardmove[1];
  if (SendLand == true) {
    SendLand = false;
    sVar20 = -0x8000;
  }
  else {
    sVar20 = sVar20 + (short)(int)dVar22;
  }
  iVar13 = iVar13 - (int)local_38;
  if ((BVar10 != '\0') || (lookstrafe.Value == true)) {
    iVar13 = iVar13 + (int)((float)mousex * m_side.Value);
  }
  iVar16 = -forwardmove[1];
  iVar3 = iVar16;
  if (iVar19 != iVar16 && SBORROW4(iVar19,iVar16) == iVar19 + forwardmove[1] < 0) {
    iVar3 = iVar19;
  }
  if (iVar13 != iVar16 && SBORROW4(iVar13,iVar16) == iVar13 + forwardmove[1] < 0) {
    iVar16 = iVar13;
  }
  mousey = 0;
  sVar17 = (short)forwardmove[1];
  sVar18 = (short)iVar3;
  if (forwardmove[1] < iVar19) {
    sVar18 = sVar17;
  }
  mousex = 0;
  psVar2 = &(cmd->ucmd).forwardmove;
  *psVar2 = *psVar2 + sVar18;
  sVar18 = (short)iVar16;
  if (iVar11 < iVar13) {
    sVar18 = sVar17;
  }
  psVar2 = &(cmd->ucmd).sidemove;
  *psVar2 = *psVar2 + sVar18;
  (cmd->ucmd).yaw = LocalViewAngle._2_2_;
  (cmd->ucmd).upmove = sVar20;
  LocalViewAngle = 0;
  LocalViewPitch = 0;
  if (sendturn180 == true) {
    sendturn180 = false;
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 0x10;
  }
  if (sendpause == true) {
    sendpause = false;
    Net_WriteByte('\x14');
  }
  if (sendsave == true) {
    sendsave = false;
    Net_WriteByte('\x15');
    Net_WriteString(savegamefile.Chars);
    Net_WriteString(savedescription);
    FString::operator=(&savegamefile,(char *)"");
  }
  if (SendItemUse != (AInventory *)0x0) {
    if (SendItemUse == (AInventory *)0x1) {
      Net_WriteByte('\x12');
    }
    else {
      Net_WriteByte('\x13');
      Net_WriteLong((SendItemUse->super_AActor).InventoryID);
    }
    SendItemUse = (AInventory *)0x0;
  }
  if (SendItemDrop != (AInventory *)0x0) {
    Net_WriteByte('\"');
    Net_WriteLong((SendItemDrop->super_AActor).InventoryID);
    SendItemDrop = (AInventory *)0x0;
  }
  uVar15._0_2_ = (cmd->ucmd).forwardmove;
  uVar15._2_2_ = (cmd->ucmd).sidemove;
  auVar23 = psllw(ZEXT416(uVar15),8);
  (cmd->ucmd).forwardmove = (short)auVar23._0_4_;
  (cmd->ucmd).sidemove = (short)((uint)auVar23._0_4_ >> 0x10);
  return;
}

Assistant:

void G_BuildTiccmd (ticcmd_t *cmd)
{
	int 		strafe;
	int 		speed;
	int 		forward;
	int 		side;
	int			fly;

	ticcmd_t	*base;

	base = I_BaseTiccmd (); 			// empty, or external driver
	*cmd = *base;

	cmd->consistancy = consistancy[consoleplayer][(maketic/ticdup)%BACKUPTICS];

	strafe = Button_Strafe.bDown;
	speed = Button_Speed.bDown ^ (int)cl_run;

	forward = side = fly = 0;

	// [RH] only use two stage accelerative turning on the keyboard
	//		and not the joystick, since we treat the joystick as
	//		the analog device it is.
	if (Button_Left.bDown || Button_Right.bDown)
		turnheld += ticdup;
	else
		turnheld = 0;

	// let movement keys cancel each other out
	if (strafe)
	{
		if (Button_Right.bDown)
			side += sidemove[speed];
		if (Button_Left.bDown)
			side -= sidemove[speed];
	}
	else
	{
		int tspeed = speed;

		if (turnheld < SLOWTURNTICS)
			tspeed += 2;		// slow turn
		
		if (Button_Right.bDown)
		{
			G_AddViewAngle (angleturn[tspeed]);
			LocalKeyboardTurner = true;
		}
		if (Button_Left.bDown)
		{
			G_AddViewAngle (-angleturn[tspeed]);
			LocalKeyboardTurner = true;
		}
	}

	if (Button_LookUp.bDown)
	{
		G_AddViewPitch (lookspeed[speed]);
		LocalKeyboardTurner = true;
	}
	if (Button_LookDown.bDown)
	{
		G_AddViewPitch (-lookspeed[speed]);
		LocalKeyboardTurner = true;
	}

	if (Button_MoveUp.bDown)
		fly += flyspeed[speed];
	if (Button_MoveDown.bDown)
		fly -= flyspeed[speed];

	if (Button_Klook.bDown)
	{
		if (Button_Forward.bDown)
			G_AddViewPitch (lookspeed[speed]);
		if (Button_Back.bDown)
			G_AddViewPitch (-lookspeed[speed]);
	}
	else
	{
		if (Button_Forward.bDown)
			forward += forwardmove[speed];
		if (Button_Back.bDown)
			forward -= forwardmove[speed];
	}

	if (Button_MoveRight.bDown)
		side += sidemove[speed];
	if (Button_MoveLeft.bDown)
		side -= sidemove[speed];

	// buttons
	if (Button_Attack.bDown)		cmd->ucmd.buttons |= BT_ATTACK;
	if (Button_AltAttack.bDown)		cmd->ucmd.buttons |= BT_ALTATTACK;
	if (Button_Use.bDown)			cmd->ucmd.buttons |= BT_USE;
	if (Button_Jump.bDown)			cmd->ucmd.buttons |= BT_JUMP;
	if (Button_Crouch.bDown)		cmd->ucmd.buttons |= BT_CROUCH;
	if (Button_Zoom.bDown)			cmd->ucmd.buttons |= BT_ZOOM;
	if (Button_Reload.bDown)		cmd->ucmd.buttons |= BT_RELOAD;

	if (Button_User1.bDown)			cmd->ucmd.buttons |= BT_USER1;
	if (Button_User2.bDown)			cmd->ucmd.buttons |= BT_USER2;
	if (Button_User3.bDown)			cmd->ucmd.buttons |= BT_USER3;
	if (Button_User4.bDown)			cmd->ucmd.buttons |= BT_USER4;

	if (Button_Speed.bDown)			cmd->ucmd.buttons |= BT_SPEED;
	if (Button_Strafe.bDown)		cmd->ucmd.buttons |= BT_STRAFE;
	if (Button_MoveRight.bDown)		cmd->ucmd.buttons |= BT_MOVERIGHT;
	if (Button_MoveLeft.bDown)		cmd->ucmd.buttons |= BT_MOVELEFT;
	if (Button_LookDown.bDown)		cmd->ucmd.buttons |= BT_LOOKDOWN;
	if (Button_LookUp.bDown)		cmd->ucmd.buttons |= BT_LOOKUP;
	if (Button_Back.bDown)			cmd->ucmd.buttons |= BT_BACK;
	if (Button_Forward.bDown)		cmd->ucmd.buttons |= BT_FORWARD;
	if (Button_Right.bDown)			cmd->ucmd.buttons |= BT_RIGHT;
	if (Button_Left.bDown)			cmd->ucmd.buttons |= BT_LEFT;
	if (Button_MoveDown.bDown)		cmd->ucmd.buttons |= BT_MOVEDOWN;
	if (Button_MoveUp.bDown)		cmd->ucmd.buttons |= BT_MOVEUP;
	if (Button_ShowScores.bDown)	cmd->ucmd.buttons |= BT_SHOWSCORES;

	// Handle joysticks/game controllers.
	float joyaxes[NUM_JOYAXIS];

	I_GetAxes(joyaxes);

	// Remap some axes depending on button state.
	if (Button_Strafe.bDown || (Button_Mlook.bDown && lookstrafe))
	{
		joyaxes[JOYAXIS_Side] = joyaxes[JOYAXIS_Yaw];
		joyaxes[JOYAXIS_Yaw] = 0;
	}
	if (Button_Mlook.bDown)
	{
		joyaxes[JOYAXIS_Pitch] = joyaxes[JOYAXIS_Forward];
		joyaxes[JOYAXIS_Forward] = 0;
	}

	if (joyaxes[JOYAXIS_Pitch] != 0)
	{
		G_AddViewPitch(joyint(joyaxes[JOYAXIS_Pitch] * 2048));
		LocalKeyboardTurner = true;
	}
	if (joyaxes[JOYAXIS_Yaw] != 0)
	{
		G_AddViewAngle(joyint(-1280 * joyaxes[JOYAXIS_Yaw]));
		LocalKeyboardTurner = true;
	}

	side -= joyint(sidemove[speed] * joyaxes[JOYAXIS_Side]);
	forward += joyint(joyaxes[JOYAXIS_Forward] * forwardmove[speed]);
	fly += joyint(joyaxes[JOYAXIS_Up] * 2048);

	// Handle mice.
	if (!Button_Mlook.bDown && !freelook)
	{
		forward += (int)((float)mousey * m_forward);
	}

	cmd->ucmd.pitch = LocalViewPitch >> 16;

	if (SendLand)
	{
		SendLand = false;
		fly = -32768;
	}

	if (strafe || lookstrafe)
		side += (int)((float)mousex * m_side);

	mousex = mousey = 0;

	// Build command.
	if (forward > MAXPLMOVE)
		forward = MAXPLMOVE;
	else if (forward < -MAXPLMOVE)
		forward = -MAXPLMOVE;
	if (side > MAXPLMOVE)
		side = MAXPLMOVE;
	else if (side < -MAXPLMOVE)
		side = -MAXPLMOVE;

	cmd->ucmd.forwardmove += forward;
	cmd->ucmd.sidemove += side;
	cmd->ucmd.yaw = LocalViewAngle >> 16;
	cmd->ucmd.upmove = fly;
	LocalViewAngle = 0;
	LocalViewPitch = 0;

	// special buttons
	if (sendturn180)
	{
		sendturn180 = false;
		cmd->ucmd.buttons |= BT_TURN180;
	}
	if (sendpause)
	{
		sendpause = false;
		Net_WriteByte (DEM_PAUSE);
	}
	if (sendsave)
	{
		sendsave = false;
		Net_WriteByte (DEM_SAVEGAME);
		Net_WriteString (savegamefile);
		Net_WriteString (savedescription);
		savegamefile = "";
	}
	if (SendItemUse == (const AInventory *)1)
	{
		Net_WriteByte (DEM_INVUSEALL);
		SendItemUse = NULL;
	}
	else if (SendItemUse != NULL)
	{
		Net_WriteByte (DEM_INVUSE);
		Net_WriteLong (SendItemUse->InventoryID);
		SendItemUse = NULL;
	}
	if (SendItemDrop != NULL)
	{
		Net_WriteByte (DEM_INVDROP);
		Net_WriteLong (SendItemDrop->InventoryID);
		SendItemDrop = NULL;
	}

	cmd->ucmd.forwardmove <<= 8;
	cmd->ucmd.sidemove <<= 8;
}